

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_rock_sample.cpp
# Opt level: O3

undefined4 __thiscall
despot::RockSampleEastScenarioLowerBound::Value
          (RockSampleEastScenarioLowerBound *this,
          vector<despot::State_*,_std::allocator<despot::State_*>_> *particles,
          RandomStreams *streams,History *history)

{
  double dVar1;
  double dVar2;
  undefined4 local_20 [4];
  
  dVar1 = (double)despot::State::Weight((vector *)particles);
  dVar2 = pow(_ParticleBelief,
              (double)(~((*(int *)(*(particles->
                                    super__Vector_base<despot::State_*,_std::allocator<despot::State_*>_>
                                    )._M_impl.super__Vector_impl_data._M_start + 0xc) >>
                         ((byte)this->rs_model_->num_rocks_ & 0x1f)) %
                        (this->rs_model_->grid_).xsize_) + this->grid_->xsize_));
  despot::ValuedAction::ValuedAction((ValuedAction *)local_20,1,dVar2 * dVar1 * 10.0);
  return local_20[0];
}

Assistant:

ValuedAction Value(const vector<State*>& particles, RandomStreams& streams,
		History& history) const {
		return ValuedAction(Compass::EAST,
			10 * State::Weight(particles)
				* Globals::Discount(grid_.xsize() - rs_model_->GetX(particles[0]) - 1));
	}